

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3PoslistCopy(char **pp,char **ppPoslist)

{
  char *__dest;
  int iVar1;
  char *p;
  int n;
  char c;
  char *pEnd;
  char **ppPoslist_local;
  char **pp_local;
  
  _n = (byte *)*ppPoslist;
  p._7_1_ = 0;
  for (; *_n != 0 || p._7_1_ != 0; _n = _n + 1) {
    p._7_1_ = *_n & 0x80;
  }
  if (pp != (char **)0x0) {
    iVar1 = (int)(_n + 1) - (int)*ppPoslist;
    __dest = *pp;
    memcpy(__dest,*ppPoslist,(long)iVar1);
    *pp = __dest + iVar1;
  }
  *ppPoslist = (char *)(_n + 1);
  return;
}

Assistant:

static void fts3PoslistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* The end of a position list is marked by a zero encoded as an FTS3 
  ** varint. A single POS_END (0) byte. Except, if the 0 byte is preceded by
  ** a byte with the 0x80 bit set, then it is not a varint 0, but the tail
  ** of some other, multi-byte, value.
  **
  ** The following while-loop moves pEnd to point to the first byte that is not 
  ** immediately preceded by a byte with the 0x80 bit set. Then increments
  ** pEnd once more so that it points to the byte immediately following the
  ** last byte in the position-list.
  */
  while( *pEnd | c ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && (*pEnd)==0 );
  }
  pEnd++;  /* Advance past the POS_END terminator byte */

  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}